

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall chatra::Thread::finish(Thread *this)

{
  SpinLock *pSVar1;
  atomic<int> *paVar2;
  Frame *this_00;
  __atomic_flag_data_type _Var3;
  int iVar4;
  pointer pFVar5;
  Node *node;
  Scope *pSVar6;
  ReferenceNode *pRVar7;
  ReferenceGroup *pRVar8;
  element_type *peVar9;
  Instance *pIVar10;
  Thread *pTVar11;
  IdPool<chatra::Requester,_chatra::Thread> *this_01;
  _Alloc_hider _Var12;
  Class *pCVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  bool bVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined4 local_50;
  undefined4 uStack_4c;
  unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_> self;
  
  while( true ) {
    pFVar5 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_00 = pFVar5 + -1;
    Frame::popAll(this_00);
    if (pFVar5[-1].exception != (TemporaryObject *)0x0) {
      node = pFVar5[-1].exceptionNode;
      _local_50 = &stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffffb0,"unhandled exception","");
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      errorAtNode(&this->super_IErrorReceiver,Error,node,(string *)&stack0xffffffffffffffb0,
                  &local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if (_local_50 != &stack0xffffffffffffffc0) {
        operator_delete(_local_50);
      }
      pCVar13 = getReferClass(((pFVar5[-1].exception)->targetRef).node);
      emitError(this,pCVar13->name,pFVar5[-1].exceptionNode,pFVar5[-1].stackTrace._M_dataplus._M_p);
      Frame::recycle(this_00,pFVar5[-1].exception);
      pFVar5[-1].exception = (TemporaryObject *)0x0;
    }
    if (pFVar5[-1].caughtException != (TemporaryObject *)0x0) {
      Frame::recycle(this_00,pFVar5[-1].caughtException);
      pFVar5[-1].caughtException = (TemporaryObject *)0x0;
    }
    if ((ulong)(((long)(this->frames).
                       super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->frames).
                       super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                       super__Vector_impl_data._M_start >> 4) * -0xf0f0f0f0f0f0f0f) < 3) break;
    popForFinish(this);
  }
  pSVar6 = (this->runtime->scope)._M_t.
           super___uniq_ptr_impl<chatra::Scope,_std::default_delete<chatra::Scope>_>._M_t.
           super__Tuple_impl<0UL,_chatra::Scope_*,_std::default_delete<chatra::Scope>_>.
           super__Head_base<0UL,_chatra::Scope_*,_false>._M_head_impl;
  local_50 = 0x8f;
  LOCK();
  paVar2 = &(pSVar6->
            super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
            ).readCount;
  (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  pmVar14 = std::__detail::
            _Map_base<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)(pSVar6->
                    super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
                    ).valueForRead._M_b._M_p,&stack0xffffffffffffffb0);
  pRVar7 = pmVar14->node;
  LOCK();
  paVar2 = &(pSVar6->
            super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
            ).readCount;
  (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if ((pRVar7->group->super_Lockable).lockRequester._M_i ==
      (this->super_IdType<chatra::Requester,_chatra::Thread>).id) {
    pRVar8 = pRVar7->group;
    iVar4 = (pRVar8->super_Lockable).lockCount;
    (pRVar8->super_Lockable).lockCount = iVar4 + -1;
    if (iVar4 < 2) {
      LOCK();
      (pRVar8->super_Lockable).lockRequester._M_i = 0xffffffffffffffff;
      UNLOCK();
    }
  }
  if (this->isInteractive == true) {
    checkTransferReq(this);
    LOCK();
    (this->readyToNextInteraction)._M_base._M_i = true;
    UNLOCK();
    peVar9 = (this->runtime->host).super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar9->_vptr_IHost[5])
              (peVar9,(this->instance->super_IdType<chatra::InstanceId,_chatra::Instance>).id);
  }
  else {
    Frame::popAll((this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1);
    _local_50 = (pointer)0x0;
    pIVar10 = this->instance;
    do {
      LOCK();
      pSVar1 = &pIVar10->lockThreads;
      _Var3 = (pSVar1->flag).super___atomic_flag_base._M_i;
      (pSVar1->flag).super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var3 != false);
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->super_IdType<chatra::Requester,_chatra::Thread>).id;
    pmVar15 = std::__detail::
              _Map_base<chatra::Requester,_std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Requester>,_std::hash<chatra::Requester>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<chatra::Requester,_std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Requester>,_std::hash<chatra::Requester>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->instance->threads,(key_type *)&local_68);
    _Var12._M_p = _local_50;
    pTVar11 = (pmVar15->_M_t).
              super___uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_>._M_t.
              super__Tuple_impl<0UL,_chatra::Thread_*,_std::default_delete<chatra::Thread>_>.
              super__Head_base<0UL,_chatra::Thread_*,_false>._M_head_impl;
    (pmVar15->_M_t).super___uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_>._M_t
    .super__Tuple_impl<0UL,_chatra::Thread_*,_std::default_delete<chatra::Thread>_>.
    super__Head_base<0UL,_chatra::Thread_*,_false>._M_head_impl = (Thread *)0x0;
    bVar16 = (Thread *)_local_50 != (Thread *)0x0;
    _local_50 = (pointer)pTVar11;
    if (bVar16) {
      ~Thread((Thread *)_Var12._M_p);
      operator_delete(_Var12._M_p);
    }
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->super_IdType<chatra::Requester,_chatra::Thread>).id;
    std::
    _Hashtable<chatra::Requester,_std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Requester>,_std::hash<chatra::Requester>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->instance->threads)._M_h);
    (pIVar10->lockThreads).flag.super___atomic_flag_base._M_i = false;
    this_01 = (this->super_IdType<chatra::Requester,_chatra::Thread>).pool;
    if (this_01 != (IdPool<chatra::Requester,_chatra::Thread> *)0x0) {
      IdPool<chatra::Requester,_chatra::Thread>::remove
                (this_01,(char *)(this->super_IdType<chatra::Requester,_chatra::Thread>).id);
      (this->super_IdType<chatra::Requester,_chatra::Thread>).pool =
           (IdPool<chatra::Requester,_chatra::Thread> *)0x0;
    }
    checkTransferReq(this);
    _Var12._M_p = _local_50;
    if ((Thread *)_local_50 != (Thread *)0x0) {
      ~Thread((Thread *)_local_50);
      operator_delete(_Var12._M_p);
    }
  }
  return;
}

Assistant:

void Thread::finish() {
	for (;;) {
		auto& f = frames.back();
		f.popAll();

		if (f.exception != nullptr) {
			errorAtNode(*this, ErrorLevel::Error, f.exceptionNode, "unhandled exception", {});
			emitError(getReferClass(f.exception->getRef())->getName(), f.exceptionNode, f.stackTrace.data());

			f.recycle(f.exception);
			f.exception = nullptr;
		}

		if (f.caughtException != nullptr) {
			f.recycle(f.caughtException);
			f.caughtException = nullptr;
		}

		if (frames.size() <= residentialFrameCount)
			break;

		popForFinish();
	}

	auto parser = runtime.scope->ref(StringId::Parser);
	if (parser.lockedBy() == getId())
		parser.unlock();

	if (isInteractive) {
		checkTransferReq();
		readyToNextInteraction = true;
		runtime.host->onInteractiveInstanceReady(instance.getId());
		return;
	}

	// Remove returned value and exceptions
	frames.back().popAll();

	std::unique_ptr<Thread> self;
	{
		std::lock_guard<SpinLock> lock(instance.lockThreads);
		self = std::move(instance.threads[getId()]);
		instance.threads.erase(getId());
	}
	remove();
	checkTransferReq();
	chatra_assert(transferReq.empty());
}